

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O2

Term * Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                 (Term *trm,Substitution *applicator,bool noSharing)

{
  uint *this;
  uint uVar1;
  TermList **ppTVar2;
  Term **ppTVar3;
  bool *pbVar4;
  VList *pVVar5;
  Self this_00;
  bool bVar6;
  Formula *pFVar7;
  TermList TVar8;
  Term *pTVar9;
  TermList TVar10;
  TermList TVar11;
  ulong uVar12;
  Literal *lit;
  uint uVar13;
  long lVar14;
  uint i;
  TermList *pTVar15;
  ulong uVar16;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> args;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> modified;
  Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> toDo;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> terms;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_78;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_68;
  DArray<Kernel::TermList> local_58;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_40;
  
  uVar13 = trm->_functor;
  if (0xfffffff8 < uVar13) {
    this = &trm[-1]._functor;
    uVar1 = (&switchD_00253bb1::switchdataD_0071c128)[~uVar13];
    switch(uVar13) {
    case 0xfffffff9:
      Lib::DArray<Kernel::TermList>::DArray(&local_58,(ulong)(*(uint *)&trm->field_0xc & 0xfffffff))
      ;
      lVar14 = 0;
      break;
    case 0xfffffffa:
      Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_78);
      Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
                (&local_68);
      Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_40);
      Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_58);
      _Unwind_Resume((long)&switchD_00253bb1::switchdataD_0071c128 + (long)(int)uVar1);
    case 0xfffffffb:
      uVar13 = trm[-1]._functor;
      pVVar5 = *(VList **)&trm[-1]._weight;
      TVar11 = applyImpl<false,Kernel::Substitution>
                         (*(uint64_t *)&trm[-1]._maxRedLen,applicator,noSharing);
      TVar10 = applyImpl<false,Kernel::Substitution>
                         (trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                          noSharing);
      TVar8 = Term::SpecialTermData::getSort((SpecialTermData *)this);
      pTVar9 = Term::createTupleLet(uVar13,pVVar5,TVar11,TVar10,TVar8);
      return pTVar9;
    case 0xfffffffc:
      pTVar9 = applyImpl<false,Kernel::Substitution>(*(Term **)this,applicator,noSharing);
      pTVar9 = Term::createTuple(pTVar9);
      return pTVar9;
    case 0xfffffffd:
      pFVar7 = applyImpl<false,Kernel::Substitution>(*(Formula **)this,applicator,noSharing);
      pTVar9 = Term::createFormula(pFVar7);
      return pTVar9;
    case 0xfffffffe:
      uVar13 = trm[-1]._functor;
      pVVar5 = *(VList **)&trm[-1]._weight;
      TVar11 = applyImpl<false,Kernel::Substitution>
                         (*(uint64_t *)&trm[-1]._maxRedLen,applicator,noSharing);
      TVar10 = applyImpl<false,Kernel::Substitution>
                         (trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                          noSharing);
      TVar8 = Term::SpecialTermData::getSort((SpecialTermData *)this);
      pTVar9 = Term::createLet(uVar13,pVVar5,TVar11,TVar10,TVar8);
      return pTVar9;
    case 0xffffffff:
      pFVar7 = applyImpl<false,Kernel::Substitution>
                         (*(Formula **)&trm[-1]._functor,applicator,noSharing);
      TVar11 = applyImpl<false,Kernel::Substitution>
                         (trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                          noSharing);
      TVar10 = applyImpl<false,Kernel::Substitution>
                         (trm->_args[(ulong)(*(uint *)&trm->field_0xc & 0xfffffff) - 1]._content,
                          applicator,noSharing);
      TVar8 = Term::SpecialTermData::getSort((SpecialTermData *)this);
      TVar8 = applyImpl<false,Kernel::Substitution>(TVar8,applicator,noSharing);
      pTVar9 = Term::createITE(pFVar7,TVar11,TVar10,TVar8);
      return pTVar9;
    }
    for (uVar16 = 0; uVar12 = (ulong)(*(uint *)&trm->field_0xc & 0xfffffff), uVar16 < uVar12;
        uVar16 = uVar16 + 1) {
      TVar11 = applyImpl<false,Kernel::Substitution>
                         (trm->_args[uVar12 + lVar14]._content,applicator,noSharing);
      local_58._array[uVar16]._content = TVar11._content;
      lVar14 = lVar14 + -1;
    }
    TVar10 = Term::SpecialTermData::getSort((SpecialTermData *)this);
    TVar11._content._0_4_ = trm[-1]._weight;
    TVar11._content._4_4_ = trm[-1]._kboWeight;
    pTVar9 = Term::createMatch(TVar10,TVar11,*(uint *)&trm->field_0xc & 0xfffffff,local_58._array);
    Lib::DArray<Kernel::TermList>::~DArray(&local_58);
    return pTVar9;
  }
  Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           &local_58);
  Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_40);
  Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled(&local_68);
  Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_78);
  Lib::Stack<bool>::push
            ((Stack<bool> *)
             local_68._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
             super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl,false);
  Lib::Stack<Kernel::TermList_*>::push
            ((Stack<Kernel::TermList_*> *)local_58._size,
             trm->_args + (*(uint *)&trm->field_0xc & 0xfffffff));
  do {
    while( true ) {
      ppTVar2 = *(TermList ***)(local_58._size + 0x10);
      *(TermList ***)(local_58._size + 0x10) = ppTVar2 + -1;
      pTVar15 = ppTVar2[-1];
      if ((pTVar15->_content & 3) == 2) break;
      Lib::Stack<Kernel::TermList_*>::push((Stack<Kernel::TermList_*> *)local_58._size,pTVar15 + -1)
      ;
      TVar11._content = pTVar15->_content;
      uVar13 = (uint)TVar11._content & 3;
      if (uVar13 == 3) {
        TVar10._content._0_4_ = (uint)TVar11._content | 3;
        TVar10._content._4_4_ = 0;
        Lib::Stack<Kernel::TermList>::push
                  ((Stack<Kernel::TermList> *)
                   local_78._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl,TVar10
                  );
LAB_00253e02:
        if (TVar10._content != TVar11._content) goto LAB_00253e0b;
      }
      else {
        if (uVar13 == 1) {
          TVar10 = Kernel::Substitution::apply(applicator,(uint)(TVar11._content >> 2));
          Lib::Stack<Kernel::TermList>::push
                    ((Stack<Kernel::TermList> *)
                     local_78._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl,
                     TVar10);
          goto LAB_00253e02;
        }
        if (((TVar11._content & 1) != 0) ||
           (((*(byte *)(TVar11._content + 0x28) & 8) != 0 &&
            (bVar6 = Term::ground((Term *)TVar11._content), bVar6)))) {
          Lib::Stack<Kernel::TermList>::push
                    ((Stack<Kernel::TermList> *)
                     local_78._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl,
                     TVar11);
        }
        else {
          this_00._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
                )(__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
                  )local_78._self;
          if (*(uint *)(TVar11._content + 8) < 0xfffffff9) {
            Lib::Stack<Kernel::Term_*>::push
                      ((Stack<Kernel::Term_*> *)
                       local_40._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl,
                       (Term *)TVar11._content);
            Lib::Stack<bool>::push
                      ((Stack<bool> *)
                       local_68._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                       .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl,false);
            Lib::Stack<Kernel::TermList_*>::push
                      ((Stack<Kernel::TermList_*> *)local_58._size,
                       (TermList *)
                       (TVar11._content + 0x28 +
                       (ulong)(*(uint *)(TVar11._content + 0xc) & 0xfffffff) * 8));
          }
          else {
            TVar11._content =
                 (uint64_t)
                 applyImpl<false,Kernel::Substitution>(TVar11._content,applicator,noSharing);
            Lib::Stack<Kernel::TermList>::push
                      ((Stack<Kernel::TermList> *)
                       this_00._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl,
                       TVar11);
          }
        }
      }
    }
    ppTVar3 = *(Term ***)
               ((long)local_40._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl +
               0x10);
    if (ppTVar3 ==
        *(Term ***)
         ((long)local_40._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 8)) {
      pbVar4 = *(bool **)((long)local_68._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                                .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl +
                         0x10);
      *(bool **)((long)local_68._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                       .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
           pbVar4 + -1;
      if (pbVar4[-1] == true) {
        uVar13 = *(uint *)&trm->field_0xc & 0xfffffff;
        pTVar15 = *(TermList **)
                   ((long)local_78._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl
                   + 0x10) + (-1 - (ulong)(uVar13 - 1));
        uVar16 = trm->_args[0]._content;
        if ((uVar16 & 0x10) == 0) {
          if ((uVar16 & 0x20) == 0) {
            if ((noSharing) || (bVar6 = canBeShared(pTVar15,(ulong)uVar13), !bVar6)) {
              trm = Term::createNonShared(trm,pTVar15);
            }
            else {
              trm = Term::create(trm,pTVar15);
            }
          }
          else {
            trm = &AtomicSort::create((AtomicSort *)trm,pTVar15)->super_Term;
          }
        }
        else {
          trm = &Literal::create((Literal *)trm,pTVar15)->super_Term;
        }
      }
      Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_78);
      Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
                (&local_68);
      Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_40);
      Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_58);
      return trm;
    }
    *(Term ***)
     ((long)local_40._self._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x10) =
         ppTVar3 + -1;
    TVar11._content = (uint64_t)ppTVar3[-1];
    pbVar4 = *(bool **)((long)local_68._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                              .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10)
    ;
    *(bool **)((long)local_68._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                     .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
         pbVar4 + -1;
    if (pbVar4[-1] == false) {
      *(TermList **)
       ((long)local_78._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
           *(TermList **)
            ((long)local_78._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 8) +
           (((ulong)((long)*(TermList **)
                            ((long)local_78._self._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>.
                                   _M_head_impl + 0x10) -
                    (long)*(TermList **)
                           ((long)local_78._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>.
                                  _M_head_impl + 8)) >> 3) -
           (ulong)(*(uint *)(TVar11._content + 0xc) & 0xfffffff));
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 local_78._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl,TVar11);
    }
    else {
      uVar13 = *(uint *)(TVar11._content + 0xc) & 0xfffffff;
      pTVar15 = *(TermList **)
                 ((long)local_78._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 0x10) + (-1 - (ulong)(uVar13 - 1));
      if ((noSharing) || (bVar6 = canBeShared(pTVar15,(ulong)uVar13), !bVar6)) {
        TVar10._content = (uint64_t)Term::createNonShared((Term *)TVar11._content,pTVar15);
      }
      else if ((*(byte *)(TVar11._content + 0x28) & 0x20) == 0) {
        TVar10._content = (uint64_t)Term::create((Term *)TVar11._content,pTVar15);
      }
      else {
        TVar10._content = (uint64_t)AtomicSort::create((AtomicSort *)TVar11._content,pTVar15);
      }
      *(TermList **)
       ((long)local_78._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
           *(TermList **)
            ((long)local_78._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 8) +
           (((ulong)((long)*(TermList **)
                            ((long)local_78._self._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>.
                                   _M_head_impl + 0x10) -
                    (long)*(TermList **)
                           ((long)local_78._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>.
                                  _M_head_impl + 8)) >> 3) -
           (ulong)(*(uint *)(TVar11._content + 0xc) & 0xfffffff));
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 local_78._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl,TVar10);
LAB_00253e0b:
      (*(bool **)((long)local_68._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                        .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10))[-1]
           = true;
    }
  } while( true );
}

Assistant:

Term* SubstHelper::applyImpl(Term* trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm->isSpecial()) {
    Term::SpecialTermData* sd = trm->getSpecialData();
    switch(trm->specialFunctor()) {
    case SpecialFunctor::ITE:
      return Term::createITE(
    applyImpl<ProcessSpecVars>(sd->getCondition(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(1), applicator, noSharing),
    applyImpl<ProcessSpecVars>(sd->getSort(), applicator, noSharing)
    );
    case SpecialFunctor::LET:
      return Term::createLet(
    sd->getFunctor(),
    sd->getVariables(),
    applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    sd->getSort()
    );
    case SpecialFunctor::FORMULA:
      return Term::createFormula(
      applyImpl<ProcessSpecVars>(sd->getFormula(), applicator, noSharing)
      );
    case SpecialFunctor::LET_TUPLE:
      return Term::createTupleLet(
        sd->getFunctor(),
        sd->getTupleSymbols(),
        applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
        applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
        sd->getSort()
        );
    case SpecialFunctor::TUPLE:
      return Term::createTuple(applyImpl<ProcessSpecVars>(sd->getTupleTerm(), applicator, noSharing));
    case SpecialFunctor::LAMBDA:
      // TODO in principle this should not be so difficult to handle
      ASSERTION_VIOLATION;
    case SpecialFunctor::MATCH: {
      DArray<TermList> terms(trm->arity());
      for (unsigned i = 0; i < trm->arity(); i++) {
        terms[i] = applyImpl<ProcessSpecVars>(*trm->nthArgument(i), applicator, noSharing);
      }
      return Term::createMatch(sd->getSort(), sd->getMatchedSort(), trm->arity(), terms.begin());
    }
    }
    ASSERTION_VIOLATION;
  }

  Recycled<Stack<TermList*>> toDo;
  Recycled<Stack<Term*>> terms;
  Recycled<Stack<bool>> modified;
  Recycled<Stack<TermList>> args;

  modified->push(false);
  toDo->push(trm->args());

  for(;;) {
    TermList* tt=toDo->pop();
    if(tt->isEmpty()) {
      if(terms->isEmpty()) {
        //we're done, args stack contains modified arguments
        //of the topleve term/literal.
        ASS(toDo->isEmpty());
        break;
      }
      Term* orig=terms->pop();
      if(!modified->pop()) {
        args->truncate(args->length() - orig->arity());
        args->push(TermList(orig));
        continue;
      }
      //here we assume, that stack is an array with
      //second topmost element as &top()-1, third at
      //&top()-2, etc...
      TermList* argLst=&args->top() - (orig->arity()-1);

      bool shouldShare=!noSharing && canBeShared(argLst, orig->arity());

      Term* newTrm;
      if(shouldShare) {
        if(orig->isSort()){
          newTrm=AtomicSort::create(static_cast<AtomicSort*>(orig), argLst);
        } else {
          newTrm=Term::create(orig,argLst);
        }
      }
      else {
        newTrm=Term::createNonShared(orig,argLst);
      }
      args->truncate(args->length() - orig->arity());
      args->push(TermList(newTrm));

      modified->setTop(true);
      continue;
    }
    toDo->push(tt->next());

    TermList tl=*tt;
    if(tl.isOrdinaryVar()) {
      TermList tDest=applicator.apply(tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    if(tl.isSpecialVar()) {
      TermList tDest=SpecVarHandler<ProcessSpecVars>::apply(applicator,tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    ASS(tl.isTerm());
    if(tl.isVar() || (tl.term()->shared() && tl.term()->ground())) {
      args->push(tl);
      continue;
    }
    Term* t = tl.term();
    if(t->isSpecial()) {
      //we handle specal terms at the top level of this function
      args->push(TermList(applyImpl<ProcessSpecVars>(t, applicator, noSharing)));
      continue;
    }
    terms->push(t);
    modified->push(false);
    toDo->push(t->args());
  }
  ASS(toDo->isEmpty());
  ASS(terms->isEmpty());
  ASS_EQ(modified->length(),1);
  ASS_EQ(args->length(),trm->arity());

  Term* result;
  if(!modified->pop()) {
    result=trm;
  }
  else {
    //here we assume, that stack is an array with
    //second topmost element as &top()-1, third at
    //&top()-2, etc...
    TermList* argLst=&args->top() - (trm->arity()-1);
    ASS_EQ(args->size(), trm->arity());
    if(trm->isLiteral()) {
      ASS(!noSharing);
      Literal* lit = static_cast<Literal*>(trm);
      result=Literal::create(lit,argLst);
    } else if(trm->isSort()){
      ASS(!noSharing);
      result=AtomicSort::create(static_cast<AtomicSort*>(trm),argLst);
    } else {
      bool shouldShare=!noSharing && canBeShared(argLst, trm->arity());
      if(shouldShare) {
        result=Term::create(trm,argLst);          
      } else {
        //At the memoent all sorts should be shared.
        result=Term::createNonShared(trm,argLst);
      }
    }
  }

  return result;
}